

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randr.c
# Opt level: O0

randr_monitor * randr_monitor_create(xcb_randr_crtc_t id,xcb_rectangle_t rect)

{
  randr_monitor *monitor;
  xcb_randr_crtc_t id_local;
  xcb_rectangle_t rect_local;
  
  rect_local = (xcb_rectangle_t)malloc(0xc);
  if (rect_local == (xcb_rectangle_t)0x0) {
    rect_local.x = 0;
    rect_local.y = 0;
    rect_local.width = 0;
    rect_local.height = 0;
  }
  else {
    *(xcb_randr_crtc_t *)rect_local = id;
    *(xcb_rectangle_t *)((long)rect_local + 4) = rect;
  }
  return (randr_monitor *)rect_local;
}

Assistant:

static struct randr_monitor *randr_monitor_create(xcb_randr_crtc_t id, xcb_rectangle_t rect)
{
        struct randr_monitor *monitor = malloc(sizeof(struct randr_monitor));

        if (monitor == NULL) {
                return NULL;
        }

        monitor->id = id;
        monitor->rect = rect;

        return monitor;
}